

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeThumbAddSPReg(MCInst *Inst,uint16_t Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  DecodeStatus DVar4;
  
  uVar1 = MCInst_getOpcode(Inst);
  if (uVar1 == 0xa81) {
    uVar1 = Insn >> 4 & 8 | Insn & 7;
    DVar2 = DecodeGPRRegisterClass(Inst,uVar1,Address_00,Decoder);
    DVar4 = MCDisassembler_Fail;
    if ((DVar2 | 2) == MCDisassembler_Success) {
      MCOperand_CreateReg0(Inst,0xc);
      DVar3 = DecodeGPRRegisterClass(Inst,uVar1,Address_01,Decoder);
      DVar4 = DVar2;
      if ((DVar3 != MCDisassembler_Success) &&
         (DVar4 = MCDisassembler_Fail, DVar3 == MCDisassembler_SoftFail)) {
        DVar4 = MCDisassembler_SoftFail;
      }
    }
  }
  else {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 == 0xa85) {
      MCOperand_CreateReg0(Inst,0xc);
      MCOperand_CreateReg0(Inst,0xc);
      DVar2 = DecodeGPRRegisterClass(Inst,Insn >> 3 & 0xf,Address_02,Decoder);
      DVar4 = (uint)(DVar2 == MCDisassembler_SoftFail);
      if (DVar2 == MCDisassembler_Success) {
        DVar4 = MCDisassembler_Success;
      }
    }
    else {
      DVar4 = MCDisassembler_Success;
    }
  }
  return DVar4;
}

Assistant:

static DecodeStatus DecodeThumbAddSPReg(MCInst *Inst, uint16_t Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	if (MCInst_getOpcode(Inst) == ARM_tADDrSP) {
		unsigned Rdm = fieldFromInstruction_2(Insn, 0, 3);
		Rdm |= fieldFromInstruction_2(Insn, 7, 1) << 3;

		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rdm, Address, Decoder)))
			return MCDisassembler_Fail;
		MCOperand_CreateReg0(Inst, ARM_SP);
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rdm, Address, Decoder)))
			return MCDisassembler_Fail;
	} else if (MCInst_getOpcode(Inst) == ARM_tADDspr) {
		unsigned Rm = fieldFromInstruction_2(Insn, 3, 4);

		MCOperand_CreateReg0(Inst, ARM_SP);
		MCOperand_CreateReg0(Inst, ARM_SP);
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}